

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LevelFileReader.cpp
# Opt level: O0

LevelFileReader * __thiscall LevelFileReader::GetWord_abi_cxx11_(LevelFileReader *this)

{
  undefined8 *in_RSI;
  allocator local_1a;
  undefined1 local_19;
  LevelFileReader *this_local;
  string *word;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,anon_var_dwarf_a91 + 0x12,&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)*in_RSI,(string *)this,'\n');
  return this;
}

Assistant:

std::string LevelFileReader::GetWord()
{
  std::string word = "";
  getline(fileStream, word, '\n');
  return word;
}